

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *f;
  Int32 IVar1;
  uint uVar2;
  optional<n_e_s::core::Pixel> oVar3;
  ImGuiIO *pIVar4;
  Time dt;
  INesController *pIVar5;
  uint uVar6;
  long lVar7;
  int __fd;
  bool bVar9;
  string_view format_str;
  format_args args;
  string_view format_str_00;
  string_view format_str_01;
  format_args args_00;
  format_args args_01;
  PpuHelper ppu_helper;
  Control control;
  Time frame_time;
  VideoMode local_5608;
  Clock delta_clock;
  SimpleRenderer simple_renderer;
  Screen screen;
  Nes nes;
  ifstream fs;
  uint auStack_5508 [124];
  RenderWindow window;
  Gui gui;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aVar8;
  
  sf::VideoMode::VideoMode(&local_5608,0x500,0x3c0,0x20);
  std::locale::locale((locale *)&screen);
  sf::String::String((String *)&gui,"n_e_s visulization",(locale *)&screen);
  _fs = (char *)0x0;
  sf::RenderWindow::RenderWindow(&window,local_5608,(String *)&gui,7,(ContextSettings *)&fs);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&gui);
  std::locale::~locale((locale *)&screen);
  sf::Window::setFramerateLimit(&window.super_Window,0x14);
  ImGui::SFML::Init(&window,true);
  pIVar4 = ImGui::GetIO();
  *(byte *)&pIVar4->ConfigFlags = (byte)pIVar4->ConfigFlags | 0x40;
  pIVar4->ConfigDockingNoSplit = true;
  nesvis::Screen::Screen(&screen,0x100,0xf0,3.0);
  n_e_s::nes::Nes::Nes(&nes);
  control.is_running_ = true;
  control.use_simple_renderer_ = false;
  control.nes_ = &nes;
  nesvis::PpuHelper::PpuHelper(&ppu_helper,&nes);
  nesvis::Gui::Gui(&gui,&nes,&ppu_helper,&control);
  nesvis::SimpleRenderer::SimpleRenderer(&simple_renderer,&nes,&ppu_helper);
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&delta_clock,argv[1],(allocator<char> *)&frame_time);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs,
                   "Loading rom from: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&delta_clock
                  );
    nesvis::LogWidget::add(&gui.log_widget,(string *)&fs);
    std::__cxx11::string::~string((string *)&fs);
    std::__cxx11::string::~string((string *)&delta_clock);
    _fs = argv[1];
    format_str.size_ = 0x15;
    format_str.data_ = "Loading rom from: {}\n";
    args.field_1.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&fs;
    args.desc_ = 0xc;
    fmt::v8::vprint(format_str,args);
    std::ifstream::ifstream(&fs,argv[1],_S_bin);
    uVar2 = *(uint *)((long)auStack_5508 + *(long *)(_fs + -0x18));
    bVar9 = (uVar2 & 5) == 0;
    if (bVar9) {
      n_e_s::nes::Nes::load_rom(&nes,(istream *)&fs);
    }
    else {
      frame_time.m_microseconds = (Int64)argv[1];
      format_str_00.size_ = 0x18;
      format_str_00.data_ = "Could not load file: {}\n";
      args_00.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&frame_time;
      args_00.desc_ = 0xc;
      fmt::v8::vprint(_stderr,format_str_00,args_00);
    }
    uVar6 = (uint)!bVar9;
    std::ifstream::~ifstream(&fs);
    if ((uVar2 & 5) != 0) goto LAB_0010f490;
  }
  nesvis::PpuWidget::load_pattern_tables(&gui.ppu_widget);
  sf::Clock::Clock(&delta_clock);
  while( true ) {
    bVar9 = sf::Window::isOpen(&window.super_Window);
    if (!bVar9) break;
    while( true ) {
      aVar8.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&fs;
      bVar9 = sf::Window::pollEvent(&window.super_Window,(Event *)&fs);
      __fd = aVar8._0_4_;
      if (!bVar9) break;
      ImGui::SFML::ProcessEvent((Event *)&fs);
      if (_fs == 0) {
        sf::Window::close(&window.super_Window,__fd);
      }
    }
    dt = sf::Clock::restart(&delta_clock);
    ImGui::SFML::Update(&window,dt);
    pIVar5 = n_e_s::nes::Nes::controller1(&nes);
    pIVar4 = ImGui::GetIO();
    if (pIVar4->WantCaptureKeyboard == false) {
      bVar9 = sf::Keyboard::isKeyPressed(A);
      (*pIVar5->_vptr_INesController[2])(pIVar5,0,(ulong)bVar9);
      bVar9 = sf::Keyboard::isKeyPressed(S);
      (*pIVar5->_vptr_INesController[2])(pIVar5,1,(ulong)bVar9);
      bVar9 = sf::Keyboard::isKeyPressed(Left);
      (*pIVar5->_vptr_INesController[2])(pIVar5,6,(ulong)bVar9);
      bVar9 = sf::Keyboard::isKeyPressed(Right);
      (*pIVar5->_vptr_INesController[2])(pIVar5,7,(ulong)bVar9);
      bVar9 = sf::Keyboard::isKeyPressed(Up);
      (*pIVar5->_vptr_INesController[2])(pIVar5,4,(ulong)bVar9);
      bVar9 = sf::Keyboard::isKeyPressed(Down);
      (*pIVar5->_vptr_INesController[2])(pIVar5,5,(ulong)bVar9);
      bVar9 = sf::Keyboard::isKeyPressed(Q);
      (*pIVar5->_vptr_INesController[2])(pIVar5,3,(ulong)bVar9);
      bVar9 = sf::Keyboard::isKeyPressed(W);
      (*pIVar5->_vptr_INesController[2])(pIVar5,2,(ulong)bVar9);
    }
    sf::Color::Color((Color *)&fs,'\0','\0','\0',0xff);
    sf::RenderTarget::clear(&window.super_RenderTarget,(Color *)&fs);
    if (control.is_running_ == true) {
      lVar7 = 0x1062c7;
      while (bVar9 = lVar7 != 0, lVar7 = lVar7 + -1, bVar9) {
        oVar3 = n_e_s::nes::Nes::execute(&nes);
        if ((((uint6)oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                     super__Optional_payload_base<n_e_s::core::Pixel> & 0x10000000000) != 0) &&
           (control.use_simple_renderer_ == false)) {
          sf::Color::Color((Color *)&fs,
                           oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._2_1_,
                           oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._3_1_,
                           oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._4_1_,0xff);
          nesvis::Screen::set_pixel
                    (&screen,oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                             super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_ &
                             0xff,
                     oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                     super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_ >> 8 & 0xff,
                     (Color *)&fs);
        }
      }
    }
    if (control.use_simple_renderer_ == true) {
      nesvis::SimpleRenderer::render(&simple_renderer,&screen);
    }
    nesvis::Gui::draw(&gui);
    nesvis::Screen::draw(&screen,&window);
    ImGui::SFML::Render(&window);
    sf::Window::display(&window.super_Window);
    frame_time.m_microseconds = dt.m_microseconds;
    IVar1 = sf::Time::asMilliseconds(&frame_time);
    f = _stderr;
    if (0x32 < IVar1) {
      uVar2 = sf::Time::asMilliseconds(&frame_time);
      _fs = (pointer)(ulong)uVar2;
      format_str_01.size_ = 0x27;
      format_str_01.data_ = "Things are running slowly: {}ms - {}ms\n";
      args_01.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&fs;
      args_01.desc_ = 0x11;
      fmt::v8::vprint(f,format_str_01,args_01);
    }
  }
  ImGui::SFML::Shutdown();
  uVar6 = 0;
LAB_0010f490:
  nesvis::Gui::~Gui(&gui);
  n_e_s::nes::Nes::~Nes(&nes);
  nesvis::Screen::~Screen(&screen);
  sf::RenderWindow::~RenderWindow(&window);
  return uVar6;
}

Assistant:

int main(int argc, char **argv) {
    sf::RenderWindow window(
            sf::VideoMode(kWinWidth, kWinHeight), "n_e_s visulization");
    constexpr int kFps = 20;
    window.setFramerateLimit(kFps);

    ImGui::SFML::Init(window);
    ImGuiIO &io = ImGui::GetIO();
    // NOLINTNEXTLINE(hicpp-signed-bitwise)
    io.ConfigFlags |= ImGuiConfigFlags_DockingEnable;
    io.ConfigDockingNoSplit = true;

    nesvis::Screen screen(kNesWidth, kNesHeight, kNesScaleFactor);
    n_e_s::nes::Nes nes;
    nesvis::Control control(&nes);
    nesvis::PpuHelper ppu_helper(&nes);
    nesvis::Gui gui(&nes, &ppu_helper, &control);

    nesvis::SimpleRenderer simple_renderer(&nes, &ppu_helper);

    try {
        if (argc > 1) {
            gui.log_widget.add("Loading rom from: " + std::string(argv[1]));
            fmt::print("Loading rom from: {}\n", argv[1]);
            std::ifstream fs(argv[1], std::ios::binary);
            if (!fs) {
                fmt::print(stderr, "Could not load file: {}\n", argv[1]);
                return 1;
            }
            nes.load_rom(fs);
        }

        gui.ppu_widget.load_pattern_tables();

        sf::Clock delta_clock;
        while (window.isOpen()) {
            poll_events(window);

            const sf::Time delta_time = delta_clock.restart();
            ImGui::SFML::Update(window, delta_time);

            handle_keys(nes.controller1());

            window.clear();

            // robinlinden/desunes
            constexpr size_t kMasterClock = 21'477'272; // Hz
            // Tick rates:
            // CPU: every 12 master ticks
            // PPU: every 4
            // APU: every 24
            constexpr size_t kNESClock = kMasterClock;
            constexpr size_t kTickPerFrame = kNESClock / kFps;
            if (control.is_running()) {
                for (size_t i = 0; i < kTickPerFrame; ++i) {
                    const auto pixel = nes.execute();
                    if (pixel && !control.use_simple_renderer()) {
                        const auto color = pixel->color;
                        screen.set_pixel(pixel->x,
                                pixel->y,
                                sf::Color(color.r, color.g, color.b));
                    }
                }
            }

            if (control.use_simple_renderer()) {
                simple_renderer.render(&screen);
            }

            gui.draw();
            screen.draw(window);

            ImGui::SFML::Render(window);
            window.display();

            const auto frame_time = delta_time;
            if (frame_time.asMilliseconds() > 1000 / kFps) {
                fmt::print(stderr,
                        "Things are running slowly: {}ms - {}ms\n",
                        frame_time.asMilliseconds(),
                        1000 / kFps);
            }
        }

        ImGui::SFML::Shutdown();
    } catch (const std::exception &e) {
        fmt::print(stderr, "Caught exception: {}\n", e.what());
    }

    return 0;
}